

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::OP_LdFuncObjProto(Var funcObj,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *threadContext;
  RecyclableObject *pRVar2;
  RecyclableObject *superCtor;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  Var funcObj_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&superCtor,threadContext);
  pRVar2 = VarTo<Js::RecyclableObject>(funcObj);
  pRVar2 = RecyclableObject::GetPrototype(pRVar2);
  if ((pRVar2 != (RecyclableObject *)0x0) && (bVar1 = IsConstructor(pRVar2), bVar1)) {
    JsReentLock::~JsReentLock((JsReentLock *)&superCtor);
    return pRVar2;
  }
  JavascriptError::ThrowTypeError((ScriptContext *)reentrancylock._24_8_,-0x7ff5ec00,(PCWSTR)0x0);
}

Assistant:

Var JavascriptOperators::OP_LdFuncObjProto(Var funcObj, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(LdFuncObjProto, reentrancylock, scriptContext->GetThreadContext());
        RecyclableObject *superCtor = VarTo<RecyclableObject>(funcObj)->GetPrototype();

        if (superCtor == nullptr || !IsConstructor(superCtor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NotAConstructor);
        }

        return superCtor;
        JIT_HELPER_END(LdFuncObjProto);
    }